

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader-network.cc
# Opt level: O2

bool tinyusdz::tydra::GetDirectlyBoundMaterial
               (Stage *_stage,Prim *prim,string *purpose,Path *materialPath,Material **material,
               string *err)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  string *err_local;
  Material **material_local;
  Path *materialPath_local;
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [48];
  ostringstream ss_e;
  
  err_local = err;
  material_local = material;
  materialPath_local = materialPath;
  if (materialPath == (Path *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/shader-network.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"GetDirectlyBoundMaterial");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb4);
    ::std::operator<<(poVar2," ");
    pcVar3 = "`materialPath` ptr is null.";
  }
  else {
    if (material != (Material **)0x0) {
      local_1e0._8_8_ = (_Invoker_type)0x0;
      local_1e0._0_8_ = operator_new(0x20);
      *(string **)local_1e0._0_8_ = purpose;
      *(Path ***)(local_1e0._0_8_ + 8) = &materialPath_local;
      *(string ***)(local_1e0._0_8_ + 0x10) = &err_local;
      *(function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::MaterialBinding_*)> **)
       (local_1e0._0_8_ + 0x18) =
           (function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::MaterialBinding_*)> *)
           &material_local;
      local_1d0._8_8_ =
           ::std::
           _Function_handler<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::MaterialBinding_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/shader-network.cc:187:20)>
           ::_M_invoke;
      local_1d0._0_8_ =
           ::std::
           _Function_handler<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::MaterialBinding_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/shader-network.cc:187:20)>
           ::_M_manager;
      bVar1 = ApplyToMaterialBinding
                        ((tydra *)_stage,(Stage *)prim,(Prim *)local_1e0,
                         (function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::MaterialBinding_*)>
                          *)&material_local);
      if ((code *)local_1d0._0_8_ == (code *)0x0) {
        return bVar1;
      }
      (*(code *)local_1d0._0_8_)(local_1e0,local_1e0,3);
      return bVar1;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/shader-network.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"GetDirectlyBoundMaterial");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb8);
    ::std::operator<<(poVar2," ");
    pcVar3 = "`material` ptr is null.";
  }
  poVar2 = ::std::operator<<((ostream *)&ss_e,pcVar3);
  ::std::operator<<(poVar2,"\n");
  if (err != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)err);
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  return false;
}

Assistant:

bool GetDirectlyBoundMaterial(
  const Stage &_stage,
  const Prim &prim,
  const std::string &purpose,
  tinyusdz::Path *materialPath,
  const Material **material,
  std::string *err) {

  if (!materialPath) {
    PUSH_ERROR_AND_RETURN("`materialPath` ptr is null.");
  }

  if (!material) {
    PUSH_ERROR_AND_RETURN("`material` ptr is null.");
  }

  auto apply_fun = [&](const Stage &stage, const MaterialBinding *mb) -> bool {

    Relationship mat_rel;
    if (!mb->get_materialBinding(value::token(purpose), &mat_rel)) {
      return false;
    }

    if (!GetSinglePath(mat_rel, materialPath)) {
      std::string binding_name = kMaterialBinding;
      if (!purpose.empty()) {
        binding_name += ":" + purpose;
      }
      PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be single targetPath", binding_name));
    }

    const Prim *p{nullptr};
    if (stage.find_prim_at_path(*materialPath, p, err)) {
      if (p->is<Material>()) {
        (*material) = p->as<Material>();
        return true;
      } else {
        (*material) = nullptr;
      }
    }

    return false;
  };

  bool ret = ApplyToMaterialBinding(_stage, prim, apply_fun);

  return ret;
}